

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_69::WindowFlowController::taskFailed
          (WindowFlowController *this,Exception *exception)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception> OStack_1c8;
  
  if ((this->state).tag == 1) {
    lVar1 = *(long *)((long)&(this->state).field_1 + 8);
    for (lVar3 = *(long *)&(this->state).field_1; lVar3 != lVar1; lVar3 = lVar3 + 0x10) {
      puVar2 = *(undefined8 **)(lVar3 + 8);
      kj::Exception::Exception((Exception *)&OStack_1c8,exception);
      (**(code **)*puVar2)(puVar2,&OStack_1c8);
      kj::Exception::~Exception((Exception *)&OStack_1c8);
    }
    kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>::
    OneOf<kj::Exception,int>
              ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
                *)&OStack_1c8,exception);
    kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
    operator=(&this->state,&OStack_1c8);
    kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
    ~OneOf(&OStack_1c8);
  }
  return;
}

Assistant:

void taskFailed(kj::Exception&& exception) override {
    KJ_SWITCH_ONEOF(state) {
      KJ_CASE_ONEOF(blockedSends, Running) {
        // Fail out all pending sends.
        for (auto& fulfiller: blockedSends) {
          fulfiller->reject(kj::cp(exception));
        }
        // Fail out all future sends.
        state = kj::mv(exception);
      }
      KJ_CASE_ONEOF(exception, kj::Exception) {
        // ignore redundant exception
      }
    }
  }